

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rcdiscover::WOL::appendMagicPacket
          (WOL *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sendbuf,
          array<unsigned_char,_4UL> *password)

{
  undefined8 in_RAX;
  int iVar1;
  int i;
  size_t j;
  long lVar2;
  int i_1;
  bool bVar3;
  undefined8 uStack_38;
  
  iVar1 = 6;
  uStack_38 = in_RAX;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    uStack_38 = CONCAT17(0xff,(undefined7)uStack_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (sendbuf,(uchar *)((long)&uStack_38 + 7));
  }
  for (iVar1 = 0; iVar1 != 0x10; iVar1 = iVar1 + 1) {
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (sendbuf,(this->hardware_addr_)._M_elems + lVar2);
    }
  }
  if (password != (array<unsigned_char,_4UL> *)0x0) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (sendbuf,password->_M_elems + lVar2);
    }
  }
  return sendbuf;
}

Assistant:

std::vector<uint8_t>& WOL::appendMagicPacket(
    std::vector<uint8_t>& sendbuf,
    const std::array<uint8_t, 4> *password) const
{
  for (int i = 0; i < 6; ++i)
  {
    sendbuf.push_back(0xFF);
  }
  for (int i = 0; i < 16; ++i)
  {
    for (size_t j = 0; j < hardware_addr_.size(); ++j)
    {
      sendbuf.push_back(hardware_addr_[j]);
    }
  }
  if (password != nullptr)
  {
    for (int i = 0; i < 4; ++i)
    {
      sendbuf.push_back((*password)[i]);
    }
  }

  return sendbuf;
}